

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  ImGuiWindow *this_local;
  
  ImDrawList::~ImDrawList(this->DrawList);
  ImGui::MemFree(this->DrawList);
  this->DrawList = (ImDrawList *)0x0;
  ImGui::MemFree(this->Name);
  this->Name = (char *)0x0;
  ImGuiStorage::~ImGuiStorage(&this->StateStorage);
  ImVector<unsigned_int>::~ImVector(&this->IDStack);
  ImGuiDrawContext::~ImGuiDrawContext(&this->DC);
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    DrawList->~ImDrawList();
    ImGui::MemFree(DrawList);
    DrawList = NULL;
    ImGui::MemFree(Name);
    Name = NULL;
}